

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O3

int GeneratedSaxParser::Utils::toInteger<int,true>
              (ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  byte bVar7;
  
  pbVar3 = (byte *)*buffer;
  if ((pbVar3 == (byte *)0x0) || (pbVar3 == (byte *)bufferEnd)) {
    *failed = true;
    return 0;
  }
  while( true ) {
    uVar5 = (ulong)*pbVar3;
    if (0x2d < uVar5) goto LAB_0080c68d;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
    pbVar3 = pbVar3 + 1;
    if (pbVar3 == (byte *)bufferEnd) {
      *failed = true;
      *buffer = bufferEnd;
      return 0;
    }
  }
  if (uVar5 == 0x2b) {
    pbVar3 = pbVar3 + 1;
  }
  else if (uVar5 == 0x2d) {
    pbVar3 = pbVar3 + 1;
    iVar4 = -1;
    goto LAB_0080c693;
  }
LAB_0080c68d:
  iVar4 = 1;
LAB_0080c693:
  pbVar6 = pbVar3;
  if (pbVar3 != (byte *)bufferEnd) {
    bVar7 = *pbVar3;
    bVar1 = bVar7 - 0x30;
    iVar2 = 0;
    if (bVar1 < 10) {
      iVar2 = 0;
      do {
        pbVar6 = pbVar6 + 1;
        iVar2 = (uint)bVar7 + iVar2 * 10 + -0x30;
        if (pbVar6 == (byte *)bufferEnd) {
          pbVar6 = (byte *)bufferEnd;
          if (pbVar3 == (byte *)bufferEnd) goto LAB_0080c6f7;
          *failed = false;
          *buffer = bufferEnd;
          goto LAB_0080c6ee;
        }
        bVar7 = *pbVar6;
      } while ((byte)(bVar7 - 0x30) < 10);
    }
    if (bVar1 < 10) {
      *buffer = (ParserChar *)pbVar6;
      *failed = false;
LAB_0080c6ee:
      return iVar2 * iVar4;
    }
  }
LAB_0080c6f7:
  *failed = true;
  *buffer = (ParserChar *)pbVar6;
  return 0;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar** buffer, const ParserChar* bufferEnd, bool& failed)
	{
		const ParserChar* s = *buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( s == bufferEnd )
		{
			failed = true;
			*buffer = bufferEnd;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( s == bufferEnd )
			{
				failed = true;
				*buffer = bufferEnd;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( s == bufferEnd )
			{
				if (digitFound)
				{
					failed = false;
					*buffer = s;
					if ( signedInteger )
						return value * sign;
					else
						return value;
				}
				else
				{
					failed = true;
					*buffer = s;
					return 0;
				}
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
				break;
			++s;
		}
		if ( digitFound )
		{
			*buffer = s;
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			*buffer = s;
			return 0;
		}
	}